

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3GetVarint32(char *p,int *pi)

{
  uint uVar1;
  uint uVar2;
  u32 a;
  uchar *ptr;
  int *pi_local;
  char *p_local;
  
  uVar1 = (uint)(byte)p[1] << 7;
  if ((uVar1 & 0x4000) == 0) {
    *pi = (byte)*p & 0x7f | uVar1;
    p_local._4_4_ = 2;
  }
  else {
    uVar1 = (byte)*p & 0x7f | uVar1 & 0x3fff;
    uVar2 = (uint)(byte)p[2] << 0xe;
    if ((uVar2 & 0x200000) == 0) {
      *pi = uVar1 | uVar2;
      p_local._4_4_ = 3;
    }
    else {
      uVar1 = uVar1 | uVar2 & 0x1fffff;
      uVar2 = (uint)(byte)p[3] << 0x15;
      if ((uVar2 & 0x10000000) == 0) {
        *pi = uVar1 | uVar2;
        p_local._4_4_ = 4;
      }
      else {
        *pi = uVar1 | uVar2 & 0xfffffff | ((byte)p[4] & 7) << 0x1c;
        p_local._4_4_ = 5;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3GetVarint32(const char *p, int *pi){
  const unsigned char *ptr = (const unsigned char*)p;
  u32 a;

#ifndef fts3GetVarint32
  GETVARINT_INIT(a, ptr, 0,  0x00,     0x80, *pi, 1);
#else
  a = (*ptr++);
  assert( a & 0x80 );
#endif

  GETVARINT_STEP(a, ptr, 7,  0x7F,     0x4000, *pi, 2);
  GETVARINT_STEP(a, ptr, 14, 0x3FFF,   0x200000, *pi, 3);
  GETVARINT_STEP(a, ptr, 21, 0x1FFFFF, 0x10000000, *pi, 4);
  a = (a & 0x0FFFFFFF );
  *pi = (int)(a | ((u32)(*ptr & 0x07) << 28));
  assert( 0==(a & 0x80000000) );
  assert( *pi>=0 );
  return 5;
}